

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O3

void __thiscall iqxmlrpc::ValueBuilder::do_visit_text(ValueBuilder *this,string *text)

{
  pointer pcVar1;
  bool bVar2;
  Date_time *this_00;
  XML_RPC_violation *this_01;
  Date_time *pDVar3;
  double local_48;
  string local_40;
  
  switch((this->state_).curr_) {
  case 0:
    (this->super_ValueBuilderBase).super_BuilderBase.want_exit_ = true;
  case 1:
    this_00 = (Date_time *)operator_new(0x28);
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Scalar_0018acb8;
    *(int **)&this_00->tm_ = &(this_00->tm_).tm_mon;
    pcVar1 = (text->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this_00->tm_,pcVar1,pcVar1 + text->_M_string_length);
    break;
  case 2:
    this_00 = (Date_time *)operator_new(0x10);
    local_48 = (double)((ulong)local_48 & 0xffffffff00000000);
    local_40._M_dataplus._M_p = (text->_M_dataplus)._M_p;
    local_40._M_string_length = (size_type)(local_40._M_dataplus._M_p + text->_M_string_length);
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_40,
                            (int *)&local_48);
    if (!bVar2) {
      local_40._M_dataplus._M_p = (pointer)&PTR__bad_cast_001891e8;
      local_40._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
      local_40.field_2._M_allocated_capacity = (size_type)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_40);
    }
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0018ab78;
    (this_00->tm_).tm_sec = local_48._0_4_;
    break;
  case 3:
    this_00 = (Date_time *)operator_new(0x10);
    local_48 = 0.0;
    local_40._M_dataplus._M_p = (text->_M_dataplus)._M_p;
    local_40._M_string_length = (size_type)(local_40._M_dataplus._M_p + text->_M_string_length);
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<long>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_40
                             ,(long *)&local_48);
    if (!bVar2) {
      local_40._M_dataplus._M_p = (pointer)&PTR__bad_cast_001891e8;
      local_40._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
      local_40.field_2._M_allocated_capacity = (size_type)&long::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_40);
    }
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0018abc8;
    *(double *)&this_00->tm_ = local_48;
    break;
  case 4:
    this_00 = (Date_time *)operator_new(0x10);
    local_48 = (double)((ulong)local_48 & 0xffffffff00000000);
    local_40._M_dataplus._M_p = (text->_M_dataplus)._M_p;
    local_40._M_string_length = (size_type)(local_40._M_dataplus._M_p + text->_M_string_length);
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_40,
                            (int *)&local_48);
    if (!bVar2) {
      local_40._M_dataplus._M_p = (pointer)&PTR__bad_cast_001891e8;
      local_40._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
      local_40.field_2._M_allocated_capacity = (size_type)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_40);
    }
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0018ac18;
    *(bool *)&(this_00->tm_).tm_sec = local_48._0_4_ != 0;
    break;
  case 5:
    this_00 = (Date_time *)operator_new(0x10);
    local_48 = 0.0;
    local_40._M_dataplus._M_p = (text->_M_dataplus)._M_p;
    local_40._M_string_length = (size_type)(local_40._M_dataplus._M_p + text->_M_string_length);
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            float_types_converter_internal<double>
                      ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_40,
                       &local_48);
    if (!bVar2) {
      local_40._M_dataplus._M_p = (pointer)&PTR__bad_cast_001891e8;
      local_40._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
      local_40.field_2._M_allocated_capacity = (size_type)&double::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_40);
    }
    (this_00->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Value_type_0018ac68;
    *(double *)&this_00->tm_ = local_48;
    break;
  case 6:
    this_00 = (Date_time *)Binary_data::from_base64(text);
    pDVar3 = (Date_time *)(this->super_ValueBuilderBase).retval._M_ptr;
    if (pDVar3 == this_00) {
      return;
    }
    goto LAB_0016a9ea;
  case 7:
    this_00 = (Date_time *)operator_new(0x60);
    Date_time::Date_time(this_00,text);
    break;
  default:
    this_01 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
    Parser::context_abi_cxx11_(&local_40,(this->super_ValueBuilderBase).super_BuilderBase.parser_);
    XML_RPC_violation::XML_RPC_violation(this_01,&local_40);
    __cxa_throw(this_01,&XML_RPC_violation::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar3 = (Date_time *)(this->super_ValueBuilderBase).retval._M_ptr;
  if (pDVar3 != this_00) {
LAB_0016a9ea:
    if (pDVar3 != (Date_time *)0x0) {
      (*(pDVar3->super_Value_type)._vptr_Value_type[1])();
    }
    (this->super_ValueBuilderBase).retval._M_ptr = &this_00->super_Value_type;
  }
  return;
}

Assistant:

void
ValueBuilder::do_visit_text(const std::string& text)
{
  using boost::lexical_cast;

  switch (state_.get_state()) {
  case VALUE:
    want_exit();
  case STRING:
    retval.reset(new String(text));
    break;

  case INT:
    retval.reset(new Int(lexical_cast<int>(text)));
    break;

  case INT64:
    retval.reset(new Int64(lexical_cast<int64_t>(text)));
    break;

  case BOOL:
    retval.reset(new Bool(lexical_cast<int>(text) != 0));
    break;

  case DOUBLE:
    retval.reset(new Double(lexical_cast<double>(text)));
    break;

  case BINARY:
    retval.reset(Binary_data::from_base64(text));
    break;

  case TIME:
    retval.reset(new Date_time(text));
    break;

  default:
    throw XML_RPC_violation(parser_.context());
  }
}